

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

uint fts5HashKey2(int nSlot,u8 b,u8 *p,int n)

{
  ulong uVar1;
  uint uVar2;
  
  uVar2 = 0xd;
  for (uVar1 = (ulong)(uint)n; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    uVar2 = uVar2 * 8 ^ uVar2 ^ (uint)p[uVar1 - 1];
  }
  return ((uint)b ^ uVar2 * 8 ^ uVar2) % (uint)nSlot;
}

Assistant:

static unsigned int fts5HashKey2(int nSlot, u8 b, const u8 *p, int n){
  int i;
  unsigned int h = 13;
  for(i=n-1; i>=0; i--){
    h = (h << 3) ^ h ^ p[i];
  }
  h = (h << 3) ^ h ^ b;
  return (h % nSlot);
}